

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_ct_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo flags)

{
  CType *pCVar1;
  ulong uVar2;
  void *pvVar3;
  void *p;
  GCudata *ud;
  CTSize sz;
  CType *dc;
  CType *cct;
  GCstr *pGStack_1f0;
  CTSize ofs;
  GCstr *str;
  TValue TStack_1e0;
  CTypeID did;
  uint8_t *sp;
  undefined8 *puStack_1d0;
  uint8_t tmpbool;
  void *tmpptr;
  CType *s;
  CTypeID sid;
  CTInfo flags_local;
  TValue *o_local;
  uint8_t *dp_local;
  CType *d_local;
  CTState *cts_local;
  CType *local_190;
  CType *local_188;
  CTState *local_180;
  uint local_174;
  CTState *local_170;
  uint local_164;
  CType *local_160;
  uint local_154;
  CType *local_150;
  uint local_144;
  CType *local_140;
  uint local_134;
  CTState *local_130;
  CType *local_128;
  CType *ct;
  CTState *local_118;
  CType *local_110;
  CTState *local_108;
  uint local_fc;
  CTState *local_f8;
  uint local_ec;
  CTState *local_e8;
  CType *local_e0;
  CTState *local_d8;
  CType *local_d0;
  CTState *local_c8;
  uint local_bc;
  CTState *local_b8;
  uint64_t local_b0;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  global_State *local_90;
  uint local_84;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  uint local_64;
  CTState *local_60;
  uint local_54;
  CTState *local_50;
  uint local_44;
  CType *local_40;
  uint local_34;
  CType *local_30;
  uint local_24;
  CType *local_20;
  uint local_14;
  CTState *local_10;
  
  s._0_4_ = 0x11;
  TStack_1e0.u64 = (uint64_t)&stack0xfffffffffffffe30;
  _sid = o;
  o_local = (TValue *)dp;
  dp_local = (uint8_t *)d;
  d_local = (CType *)cts;
  if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
    s._0_4_ = 0xe;
    s._4_4_ = flags | 2;
    TStack_1e0 = (TValue)o;
  }
  else {
    s._4_4_ = flags;
    if ((int)(o->field_4).it >> 0xf == -0xb) {
      TStack_1e0.u64 = (o->u64 & 0x7fffffffffff) + 0x10;
      local_134 = (uint)*(ushort *)((o->u64 & 0x7fffffffffff) + 10);
      s._0_4_ = local_134;
      if ((cts->tab[local_134].info & 0xf0800000) == 0x20800000) {
        TStack_1e0.u64 = *TStack_1e0.u64;
        s._0_4_ = cts->tab[local_134].info & 0xffff;
      }
      ct._4_4_ = (uint)s;
      local_ec = (uint)s;
      local_64 = (uint)s;
      local_128 = cts->tab + (uint)s;
      while (local_128->info >> 0x1c == 8) {
        local_110 = local_128;
        local_fc = local_128->info & 0xffff;
        local_108 = cts;
        local_f8 = cts;
        local_74 = local_fc;
        local_70 = cts;
        local_128 = cts->tab + local_fc;
      }
      tmpptr = local_128;
      local_130 = cts;
      local_118 = cts;
      local_e8 = cts;
      local_60 = cts;
      local_54 = local_134;
      local_50 = cts;
      if (local_128->info >> 0x1c != 6) {
        if (local_128->info >> 0x1c == 5) {
          local_188 = local_128;
          local_174 = local_128->info & 0xffff;
          tmpptr = cts->tab + local_174;
          local_180 = cts;
          local_170 = cts;
          local_14 = local_174;
          local_10 = cts;
        }
        goto LAB_0019194d;
      }
      str._4_4_ = (uint)(((long)d - (long)cts->tab) / 0x18);
      s._0_4_ = lj_ctype_intern(cts,((uint)s | 0x30000) + 0x20000000,8);
      local_140 = d_local;
      local_144 = str._4_4_;
      local_40 = d_local;
      local_44 = str._4_4_;
      dp_local = (uint8_t *)(*(long *)d_local + (ulong)str._4_4_ * 0x18);
    }
    else if ((int)(o->field_4).it >> 0xf == -5) {
      pGStack_1f0 = (GCstr *)(o->u64 & 0x7fffffffffff);
      if (d->info >> 0x1c == 5) {
        pCVar1 = lj_ctype_getfieldq(cts,d,pGStack_1f0,(CTSize *)((long)&cct + 4),(CTInfo *)0x0);
        if ((pCVar1 == (CType *)0x0) || (pCVar1->info >> 0x1c != 0xb)) {
LAB_001918d6:
          cconv_err_convtv((CTState *)d_local,(CType *)dp_local,_sid,s._4_4_);
        }
        TStack_1e0.u64 = (uint64_t)&pCVar1->size;
        s._0_4_ = pCVar1->info & 0xffff;
      }
      else {
        local_e0 = d;
        if ((d->info & 0xfc000000) == 0x30000000) {
          do {
            local_d0 = local_e0;
            local_bc = local_e0->info & 0xffff;
            local_e0 = cts->tab + local_bc;
          } while (local_e0->info >> 0x1c == 8);
          ud._4_4_ = pGStack_1f0->len + 1;
          local_d8 = cts;
          local_c8 = cts;
          local_b8 = cts;
          local_84 = local_bc;
          local_80 = cts;
          if (((local_e0->info & 0xfc000000) == 0) && (local_e0->size == 1)) {
            if ((d->size != 0) && (d->size < ud._4_4_)) {
              ud._4_4_ = d->size;
            }
            memcpy(dp,pGStack_1f0 + 1,(ulong)ud._4_4_);
            return;
          }
          goto LAB_001918d6;
        }
        TStack_1e0.u64 = (uint64_t)(pGStack_1f0 + 1);
        s._0_4_ = 0x15;
        s._4_4_ = flags | 2;
      }
    }
    else {
      if ((int)(o->field_4).it >> 0xf == -0xc) {
        if (d->info >> 0x1c == 3) {
          cconv_array_tab(cts,d,dp,(GCtab *)(o->u64 & 0x7fffffffffff),flags);
          return;
        }
        if (d->info >> 0x1c == 1) {
          cconv_struct_tab(cts,d,dp,(GCtab *)(o->u64 & 0x7fffffffffff),flags);
          return;
        }
        goto LAB_001918d6;
      }
      if (((int)(o->field_4).it >> 0xf == -2) || ((int)(o->field_4).it >> 0xf == -3)) {
        sp._7_1_ = -2 - (char)((int)(o->field_4).it >> 0xf);
        TStack_1e0.u64 = (long)&sp + 7;
        s._0_4_ = 3;
      }
      else if (o->u64 == 0xffffffffffffffff) {
        puStack_1d0 = (undefined8 *)0x0;
        s._4_4_ = flags | 2;
      }
      else if ((int)(o->field_4).it >> 0xf == -0xd) {
        uVar2 = o->u64 & 0x7fffffffffff;
        puStack_1d0 = (undefined8 *)(uVar2 + 0x30);
        if (*(char *)(uVar2 + 10) == '\x01') {
          puStack_1d0 = (undefined8 *)*puStack_1d0;
        }
        else if (*(char *)(uVar2 + 10) == '\x03') {
          puStack_1d0 = *(undefined8 **)(uVar2 + 0x58);
        }
      }
      else {
        if ((int)(o->field_4).it >> 0xf != -4) {
          if (((int)(o->field_4).it >> 0xf == -9) &&
             (pvVar3 = lj_ccallback_new(cts,d,(GCfunc *)(o->u64 & 0x7fffffffffff)),
             pvVar3 != (void *)0x0)) {
            o_local->u64 = (uint64_t)pvVar3;
            return;
          }
          goto LAB_001918d6;
        }
        local_90 = cts->g;
        seg = o->u64;
        segmap = (uint32_t *)(seg >> 0x27 & 0xff);
        local_b0 = (local_90->gc).lightudseg.ptr64;
        puStack_1d0 = (undefined8 *)
                      ((ulong)*(uint *)(local_b0 + (long)segmap * 4) << 0x20 | seg & 0x7fffffffff);
        u = (uint64_t)o;
      }
    }
  }
  local_150 = d_local;
  local_154 = (uint)s;
  local_30 = d_local;
  local_34 = (uint)s;
  tmpptr = (void *)(*(long *)d_local + (ulong)(uint)s * 0x18);
LAB_0019194d:
  if (*(uint *)dp_local >> 0x1c == 5) {
    local_190 = d_local;
    cts_local = (CTState *)dp_local;
    local_164 = *(uint *)dp_local & 0xffff;
    local_160 = d_local;
    local_20 = d_local;
    dp_local = (uint8_t *)(*(long *)d_local + (ulong)local_164 * 0x18);
    local_24 = local_164;
  }
  lj_cconv_ct_ct((CTState *)d_local,(CType *)dp_local,(CType *)tmpptr,(uint8_t *)&o_local->u64,
                 (uint8_t *)TStack_1e0,s._4_4_);
  return;
}

Assistant:

void lj_cconv_ct_tv(CTState *cts, CType *d,
		    uint8_t *dp, TValue *o, CTInfo flags)
{
  CTypeID sid = CTID_P_VOID;
  CType *s;
  void *tmpptr;
  uint8_t tmpbool, *sp = (uint8_t *)&tmpptr;
  if (LJ_LIKELY(tvisint(o))) {
    sp = (uint8_t *)&o->i;
    sid = CTID_INT32;
    flags |= CCF_FROMTV;
  } else if (LJ_LIKELY(tvisnum(o))) {
    sp = (uint8_t *)&o->n;
    sid = CTID_DOUBLE;
    flags |= CCF_FROMTV;
  } else if (tviscdata(o)) {
    sp = cdataptr(cdataV(o));
    sid = cdataV(o)->ctypeid;
    s = ctype_get(cts, sid);
    if (ctype_isref(s->info)) {  /* Resolve reference for value. */
      lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isfunc(s->info)) {
      CTypeID did = ctype_typeid(cts, d);
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      d = ctype_get(cts, did);  /* cts->tab may have been reallocated. */
    } else {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      goto doconv;
    }
  } else if (tvisstr(o)) {
    GCstr *str = strV(o);
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      if (!cct || !ctype_isconstval(cct->info))
	goto err_conv;
      lj_assertCTS(d->size == 4, "only 32 bit enum supported");  /* NYI */
      sp = (uint8_t *)&cct->size;
      sid = ctype_cid(cct->info);
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      CType *dc = ctype_rawchild(cts, d);
      CTSize sz = str->len+1;
      if (!ctype_isinteger(dc->info) || dc->size != 1)
	goto err_conv;
      if (d->size != 0 && d->size < sz)
	sz = d->size;
      memcpy(dp, strdata(str), sz);
      return;
    } else {  /* Otherwise pass it as a const char[]. */
      sp = (uint8_t *)strdata(str);
      sid = CTID_A_CCHAR;
      flags |= CCF_FROMTV;
    }
  } else if (tvistab(o)) {
    if (ctype_isarray(d->info)) {
      cconv_array_tab(cts, d, dp, tabV(o), flags);
      return;
    } else if (ctype_isstruct(d->info)) {
      cconv_struct_tab(cts, d, dp, tabV(o), flags);
      return;
    } else {
      goto err_conv;
    }
  } else if (tvisbool(o)) {
    tmpbool = boolV(o);
    sp = &tmpbool;
    sid = CTID_BOOL;
  } else if (tvisnil(o)) {
    tmpptr = (void *)0;
    flags |= CCF_FROMTV;
  } else if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    tmpptr = uddata(ud);
    if (ud->udtype == UDTYPE_IO_FILE)
      tmpptr = *(void **)tmpptr;
    else if (ud->udtype == UDTYPE_BUFFER)
      tmpptr = ((SBufExt *)tmpptr)->r;
  } else if (tvislightud(o)) {
    tmpptr = lightudV(cts->g, o);
  } else if (tvisfunc(o)) {
    void *p = lj_ccallback_new(cts, d, funcV(o));
    if (p) {
      *(void **)dp = p;
      return;
    }
    goto err_conv;
  } else {
  err_conv:
    cconv_err_convtv(cts, d, o, flags);
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  lj_cconv_ct_ct(cts, d, s, dp, sp, flags);
}